

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

object_ptr __thiscall mjs::object::get_accessor_property_object(object *this,wstring_view name)

{
  wstring_view key;
  bool bVar1;
  property_attribute attributes;
  logic_error *this_00;
  object_ptr *p;
  wchar_t *in_RCX;
  undefined8 extraout_RDX;
  object *this_01;
  object_ptr oVar2;
  value local_88;
  object *local_50;
  pair<mjs::object::property_*,_mjs::gc_vector<mjs::object::property>_*> local_40;
  property *local_30;
  property *it;
  object *this_local;
  wstring_view name_local;
  
  local_50 = (object *)name._M_str;
  this_01 = (object *)name._M_len;
  key._M_str = in_RCX;
  key._M_len = (size_t)local_50;
  it = (property *)this_01;
  this_local = local_50;
  name_local._M_str = (wchar_t *)this;
  local_40 = find(this_01,key);
  local_30 = local_40.first;
  attributes = property::attributes(local_40.first);
  bVar1 = has_attributes(attributes,accessor);
  if (!bVar1) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this_00,"get_accessor_property_fields called on non-accessor property");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  property::raw_get(&local_88,local_30,this_01->heap_);
  p = value::object_value(&local_88);
  gc_heap_ptr<mjs::object>::gc_heap_ptr((gc_heap_ptr<mjs::object> *)this,p);
  value::~value(&local_88);
  oVar2.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  oVar2.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (object_ptr)oVar2.super_gc_heap_ptr_untyped;
}

Assistant:

object_ptr object::get_accessor_property_object(const std::wstring_view name) {
    auto it = find(name).first;
    if (!has_attributes(it->attributes(), property_attribute::accessor)) {
        throw std::logic_error{"get_accessor_property_fields called on non-accessor property"};
    }
    return it->raw_get(heap_).object_value();
}